

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O3

uint32_t duckdb_brotli::BrotliBuildSimpleHuffmanTable
                   (HuffmanCode *table,int root_bits,uint16_t *val,uint32_t num_symbols)

{
  ushort uVar1;
  uint16_t t;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint32_t uVar6;
  uint16_t uVar7;
  long lVar8;
  uint16_t t_1;
  ulong uVar9;
  
  uVar9 = 1;
  uVar6 = 1 << ((byte)root_bits & 0x1f);
  switch(num_symbols) {
  case 0:
    *table = (HuffmanCode)((uint)*val << 0x10);
    break;
  case 1:
    if (*val < val[1]) {
      *table = (HuffmanCode)((uint)*val * 0x10000 + 1);
      uVar1 = val[1];
    }
    else {
      *table = (HuffmanCode)((uint)val[1] * 0x10000 + 1);
      uVar1 = *val;
    }
    table[1] = (HuffmanCode)((uint)uVar1 * 0x10000 + 1);
    uVar9 = 2;
    break;
  case 2:
    *table = (HuffmanCode)((uint)*val * 0x10000 + 1);
    table[2] = (HuffmanCode)((uint)*val * 0x10000 + 1);
    if (val[1] < val[2]) {
      table[1] = (HuffmanCode)((uint)val[1] << 0x10 | 2);
      uVar2 = (uint)val[2];
    }
    else {
      table[1] = (HuffmanCode)((uint)val[2] << 0x10 | 2);
      uVar2 = (uint)val[1];
    }
    goto LAB_0032ebe5;
  case 3:
    lVar3 = 1;
    lVar4 = 0;
    do {
      lVar5 = lVar4 + 1;
      uVar7 = val[lVar4];
      lVar8 = lVar3;
      do {
        uVar1 = val[lVar8];
        if (uVar1 < uVar7) {
          val[lVar8] = uVar7;
          val[lVar4] = uVar1;
          uVar7 = uVar1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar3 = lVar3 + 1;
      lVar4 = lVar5;
    } while (lVar5 != 3);
    *table = (HuffmanCode)((uint)*val << 0x10 | 2);
    table[2] = (HuffmanCode)((uint)val[1] << 0x10 | 2);
    table[1] = (HuffmanCode)((uint)val[2] << 0x10 | 2);
    uVar2 = (uint)val[3];
LAB_0032ebe5:
    table[3] = (HuffmanCode)(uVar2 << 0x10 | 2);
    uVar9 = 4;
    break;
  case 4:
    uVar1 = val[3];
    if (uVar1 < val[2]) {
      val[3] = val[2];
      val[2] = uVar1;
    }
    *table = (HuffmanCode)((uint)*val * 0x10000 + 1);
    table[1] = (HuffmanCode)((uint)val[1] << 0x10 | 2);
    table[2] = (HuffmanCode)((uint)*val * 0x10000 + 1);
    table[3] = (HuffmanCode)((uint)val[2] << 0x10 | 3);
    table[4] = (HuffmanCode)((uint)*val * 0x10000 + 1);
    table[5] = (HuffmanCode)((uint)val[1] << 0x10 | 2);
    table[6] = (HuffmanCode)((uint)*val * 0x10000 + 1);
    table[7] = (HuffmanCode)((uint)val[3] << 0x10 | 3);
    uVar9 = 8;
  }
  for (; (uint32_t)uVar9 != uVar6; uVar9 = (ulong)((uint32_t)uVar9 * 2)) {
    switchD_00332694::default(table + uVar9,table,uVar9 << 2);
  }
  return uVar6;
}

Assistant:

uint32_t duckdb_brotli::BrotliBuildSimpleHuffmanTable(HuffmanCode* table,
                                       int root_bits,
                                       uint16_t* val,
                                       uint32_t num_symbols) {
  uint32_t table_size = 1;
  const uint32_t goal_size = 1U << root_bits;
  switch (num_symbols) {
    case 0:
      table[0] = ConstructHuffmanCode(0, val[0]);
      break;
    case 1:
      if (val[1] > val[0]) {
        table[0] = ConstructHuffmanCode(1, val[0]);
        table[1] = ConstructHuffmanCode(1, val[1]);
      } else {
        table[0] = ConstructHuffmanCode(1, val[1]);
        table[1] = ConstructHuffmanCode(1, val[0]);
      }
      table_size = 2;
      break;
    case 2:
      table[0] = ConstructHuffmanCode(1, val[0]);
      table[2] = ConstructHuffmanCode(1, val[0]);
      if (val[2] > val[1]) {
        table[1] = ConstructHuffmanCode(2, val[1]);
        table[3] = ConstructHuffmanCode(2, val[2]);
      } else {
        table[1] = ConstructHuffmanCode(2, val[2]);
        table[3] = ConstructHuffmanCode(2, val[1]);
      }
      table_size = 4;
      break;
    case 3: {
      int i, k;
      for (i = 0; i < 3; ++i) {
        for (k = i + 1; k < 4; ++k) {
          if (val[k] < val[i]) {
            uint16_t t = val[k];
            val[k] = val[i];
            val[i] = t;
          }
        }
      }
      table[0] = ConstructHuffmanCode(2, val[0]);
      table[2] = ConstructHuffmanCode(2, val[1]);
      table[1] = ConstructHuffmanCode(2, val[2]);
      table[3] = ConstructHuffmanCode(2, val[3]);
      table_size = 4;
      break;
    }
    case 4: {
      if (val[3] < val[2]) {
        uint16_t t = val[3];
        val[3] = val[2];
        val[2] = t;
      }
      table[0] = ConstructHuffmanCode(1, val[0]);
      table[1] = ConstructHuffmanCode(2, val[1]);
      table[2] = ConstructHuffmanCode(1, val[0]);
      table[3] = ConstructHuffmanCode(3, val[2]);
      table[4] = ConstructHuffmanCode(1, val[0]);
      table[5] = ConstructHuffmanCode(2, val[1]);
      table[6] = ConstructHuffmanCode(1, val[0]);
      table[7] = ConstructHuffmanCode(3, val[3]);
      table_size = 8;
      break;
    }
  }
  while (table_size != goal_size) {
    memcpy(&table[table_size], &table[0],
           (size_t)table_size * sizeof(table[0]));
    table_size <<= 1;
  }
  return goal_size;
}